

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_generic.c
# Opt level: O0

netaddr * os_interface_generic_get_bindaddress(int af_type,netaddr_acl *filter,os_interface *os_if)

{
  netaddr *local_28;
  netaddr *result;
  os_interface *os_if_local;
  netaddr_acl *filter_local;
  int af_type_local;
  
  local_28 = (netaddr *)0x0;
  if ((os_if == (os_interface *)0x0) || (((os_if->flags).any & 1U) != 0)) {
    local_28 = _get_fixed_prefix(af_type,filter);
  }
  if (local_28 == (netaddr *)0x0) {
    local_28 = _get_exact_match_bindaddress(af_type,filter,os_if);
  }
  if (local_28 == (netaddr *)0x0) {
    local_28 = _get_matching_bindaddress(af_type,filter,os_if);
  }
  return local_28;
}

Assistant:

const struct netaddr *
os_interface_generic_get_bindaddress(int af_type, struct netaddr_acl *filter, struct os_interface *os_if) {
  const struct netaddr *result;

  result = NULL;
  if (os_if == NULL || os_if->flags.any) {
    result = _get_fixed_prefix(af_type, filter);
  }
  if (!result) {
    result = _get_exact_match_bindaddress(af_type, filter, os_if);
  }
  if (!result) {
    result = _get_matching_bindaddress(af_type, filter, os_if);
  }
  return result;
}